

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  long lVar5;
  int argc_local;
  
  argc_local = argc;
  testing::InitGoogleTest(&argc_local,argv);
  lVar5 = 1;
  while( true ) {
    if (argc_local <= lVar5) {
      puVar4 = (undefined1 *)manifold::ManifoldParams();
      *puVar4 = 1;
      lVar5 = manifold::ManifoldParams();
      *(undefined1 *)(lVar5 + 2) = 0;
      RegisterPolygonTests();
      iVar2 = RUN_ALL_TESTS();
      return iVar2;
    }
    if (*argv[lVar5] != '-') break;
    cVar1 = argv[lVar5][1];
    if (cVar1 == 'c') {
      lVar3 = manifold::ManifoldParams();
      *(undefined1 *)(lVar3 + 1) = 1;
    }
    else if (cVar1 == 'e') {
      puts("Export not possible because MANIFOLD_EXPORT compile flag is not set.");
      options.exportModels = true;
    }
    else {
      if (cVar1 != 'v') {
        if (cVar1 == 'h') {
          print_usage();
          return 0;
        }
        break;
      }
      lVar3 = manifold::ManifoldParams();
      *(undefined4 *)(lVar3 + 8) = 1;
      if (argv[lVar5][2] == 'v') {
        lVar3 = manifold::ManifoldParams();
        *(undefined4 *)(lVar3 + 8) = 2;
      }
    }
    lVar5 = lVar5 + 1;
  }
  fprintf(_stderr,"Unknown option: %s\n");
  print_usage();
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  ::testing::InitGoogleTest(&argc, argv);

  const char* name = "test setup";
  FrameMarkStart(name);

  // warmup tbb for emscripten, according to
  // https://github.com/oneapi-src/oneTBB/blob/master/WASM_Support.md#limitations
#if defined(__EMSCRIPTEN__) && (MANIFOLD_PAR == 1)
  int num_threads = tbb::this_task_arena::max_concurrency();
  std::atomic<int> barrier{num_threads};
  tbb::parallel_for(
      0, num_threads,
      [&barrier](int) {
        barrier--;
        while (barrier > 0) {
          // Send browser thread to event loop
          std::this_thread::yield();
        }
      },
      tbb::static_partitioner{});
#endif

  for (int i = 1; i < argc; i++) {
    if (argv[i][0] != '-') {
      fprintf(stderr, "Unknown option: %s\n", argv[i]);
      print_usage();
      return 1;
    }
    switch (argv[i][1]) {
      case 'h':
        print_usage();
        return 0;
      case 'e':
#ifndef MANIFOLD_EXPORT
        printf(
            "Export not possible because MANIFOLD_EXPORT compile flag is not "
            "set.\n");
#endif
        options.exportModels = true;
        break;
      case 'v':
        manifold::ManifoldParams().verbose = 1;
        if (argv[i][2] == 'v') {
          manifold::ManifoldParams().verbose = 2;
        }
        break;
      case 'c':
        manifold::ManifoldParams().selfIntersectionChecks = true;
        break;
      default:
        fprintf(stderr, "Unknown option: %s\n", argv[i]);
        print_usage();
        return 1;
    }
  }

  manifold::ManifoldParams().intermediateChecks = true;
  manifold::ManifoldParams().processOverlaps = false;

  FrameMarkEnd(name);

  RegisterPolygonTests();
  return RUN_ALL_TESTS();
}